

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::select_base::add(select_base *this,message *str)

{
  long in_RDI;
  element *this_00;
  string id;
  value_type *in_stack_fffffffffffffed8;
  message *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  element *in_stack_ffffffffffffff10;
  unsigned_long in_stack_ffffffffffffff28;
  string local_30 [48];
  
  this_00 = (element *)(in_RDI + 0x200);
  std::
  vector<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
  ::size((vector<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
          *)this_00);
  impl::todec_string<unsigned_long>(in_stack_ffffffffffffff28);
  element::element(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  std::
  vector<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
  ::push_back((vector<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
               *)this_00,in_stack_fffffffffffffed8);
  element::~element(this_00);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void select_base::add(locale::message const &str)
{
	std::string id= impl::todec_string(elements_.size());
	elements_.push_back(element(id,str));
}